

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

string * cmGraphVizWriter::PathSafeString(string *__return_storage_ptr__,string *str)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  undefined1 uVar3;
  _Base_ptr p_Var4;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  char *pcVar9;
  char *pcVar10;
  initializer_list<char> __l;
  set<char,_std::less<char>,_std::allocator<char>_> extra_chars;
  allocator_type local_72;
  less<char> local_71;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  char local_63 [3];
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_60;
  
  local_70 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_63[0] = '.';
  local_63[1] = '-';
  local_63[2] = 0x5f;
  __l._M_len = 3;
  __l._M_array = local_63;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)&local_60,__l,&local_71,&local_72)
  ;
  if (str->_M_string_length != 0) {
    pcVar10 = (str->_M_dataplus)._M_p;
    pcVar9 = pcVar10 + str->_M_string_length;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    do {
      cVar2 = *pcVar10;
      iVar5 = isalnum((int)cVar2);
      if (iVar5 == 0) {
        p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = &p_Var1->_M_header;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          do {
            p_Var7 = p_Var8;
            p_Var6 = p_Var4;
            uVar3 = (undefined1)p_Var6[1]._M_color;
            p_Var8 = p_Var6;
            if ((char)uVar3 < cVar2) {
              p_Var8 = p_Var7;
            }
            p_Var4 = (&p_Var6->_M_left)[(char)uVar3 < cVar2];
          } while ((&p_Var6->_M_left)[(char)uVar3 < cVar2] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var8 != p_Var1) {
            if ((char)uVar3 < cVar2) {
              p_Var6 = p_Var7;
            }
            if ((char)p_Var6[1]._M_color <= cVar2) goto LAB_004d97bd;
          }
        }
      }
      else {
LAB_004d97bd:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != pcVar9);
  }
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGraphVizWriter::PathSafeString(std::string const& str)
{
  std::string pathSafeStr;

  // We'll only keep alphanumerical characters, plus the following ones that
  // are common, and safe on all platforms:
  auto const extra_chars = std::set<char>{ '.', '-', '_' };

  for (char c : str) {
    if (std::isalnum(c) || extra_chars.find(c) != extra_chars.cend()) {
      pathSafeStr += c;
    }
  }

  return pathSafeStr;
}